

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O0

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_>::begin_fixed
          (tree<libDAI::BoundTreeNode,_std::allocator<tree_node_<libDAI::BoundTreeNode>_>_> *this,
          iterator_base *pos,uint dp)

{
  long lVar1;
  range_error *this_00;
  uint in_ECX;
  long *in_RDX;
  fixed_depth_iterator *in_RDI;
  uint curdepth;
  tree_node *tmp;
  tree_node *in_stack_ffffffffffffffa8;
  uint local_2c;
  long *local_28;
  
  local_28 = (long *)*in_RDX;
  local_2c = 0;
  do {
    if (in_ECX <= local_2c) {
      fixed_depth_iterator::fixed_depth_iterator(in_RDI,in_stack_ffffffffffffffa8);
      return in_RDI;
    }
    for (; local_28[1] == 0; local_28 = (long *)local_28[4]) {
      lVar1 = local_28[4];
      while (lVar1 == 0) {
        local_28 = (long *)*local_28;
        if (local_28 == (long *)0x0) {
          this_00 = (range_error *)__cxa_allocate_exception(0x10);
          std::range_error::range_error(this_00,"tree: begin_fixed out of range");
          __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
        }
        local_2c = local_2c - 1;
        lVar1 = local_28[4];
      }
    }
    local_28 = (long *)local_28[1];
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

typename tree<T, tree_node_allocator>::fixed_depth_iterator tree<T, tree_node_allocator>::begin_fixed(const iterator_base& pos, unsigned int dp) const
   {
   tree_node *tmp=pos.node;
   unsigned int curdepth=0;
   while(curdepth<dp) { // go down one level
      while(tmp->first_child==0) {
         if(tmp->next_sibling==0) {
            // try to walk up and then right again
            do {
               tmp=tmp->parent;
               if(tmp==0) 
                  throw std::range_error("tree: begin_fixed out of range");
               --curdepth;
               } while(tmp->next_sibling==0);
            }
         tmp=tmp->next_sibling;
         }
      tmp=tmp->first_child;
      ++curdepth;
      }
   return tmp;
   }